

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

bool __thiscall Parser::IsCurBlockInLoop(Parser *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  anon_union_8_2_ecfd7102_for_StmtNest_0 aVar6;
  byte unaff_BL;
  StmtNest *pSVar7;
  
  pSVar7 = this->m_pstmtCur;
  if (pSVar7 != (StmtNest *)0x0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if ((((ulong)pSVar7->field_0 & 1) == 0) &&
         (pSVar7->field_0 == (anon_union_8_2_ecfd7102_for_StmtNest_0)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.h"
                           ,0x65,"(isDeferred || pnodeStmt != nullptr)",
                           "isDeferred || pnodeStmt != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      if (((ulong)pSVar7->field_0 & 1) == 0) {
        aVar6 = pSVar7->field_0;
      }
      else {
        aVar6 = (anon_union_8_2_ecfd7102_for_StmtNest_0)&(pSVar7->field_0).field_1.op;
      }
      bVar1 = *(byte *)aVar6;
      uVar4 = ParseNode::Grfnop((uint)bVar1);
      unaff_BL = unaff_BL & bVar1 != 0x55 | (char)uVar4 < '\0';
      if ((char)uVar4 < '\0') {
        return (bool)unaff_BL;
      }
      if (bVar1 == 0x55) {
        return (bool)unaff_BL;
      }
      pSVar7 = pSVar7->pstmtOuter;
    } while (pSVar7 != (StmtNest *)0x0);
  }
  return false;
}

Assistant:

bool Parser::IsCurBlockInLoop() const
{
    for (StmtNest *stmt = this->m_pstmtCur; stmt != nullptr; stmt = stmt->pstmtOuter)
    {
        OpCode nop = stmt->GetNop();
        if (ParseNode::Grfnop(nop) & fnopContinue)
        {
            return true;
        }
        if (nop == knopFncDecl)
        {
            return false;
        }
    }
    return false;
}